

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

Result __thiscall tonk::gateway::SSDPRequester::InitializeSockets(SSDPRequester *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_> *pbVar4;
  char *pcVar5;
  ErrorResult *this_00;
  socklen_t in_ECX;
  ErrorResult *in_RDI;
  error_code eVar6;
  address bindAddr;
  UDPAddress bindAddress;
  error_code ec;
  address *in_stack_fffffffffffffcc8;
  undefined6 in_stack_fffffffffffffcd0;
  unsigned_short in_stack_fffffffffffffcd6;
  string *in_stack_fffffffffffffcd8;
  ErrorType EVar7;
  error_code *this_01;
  string *in_stack_fffffffffffffce0;
  string *desc;
  error_code *in_stack_fffffffffffffce8;
  ErrorResult *source;
  ErrorResult *in_stack_fffffffffffffcf0;
  io_context *in_stack_fffffffffffffcf8;
  SSDPRequester *in_stack_fffffffffffffd10;
  string *psVar8;
  string local_250 [32];
  int local_230;
  string local_220 [32];
  int local_200;
  error_category *local_1f8;
  boolean<1,_2> local_1ec;
  string local_1e8 [32];
  int local_1c8;
  int local_1b4 [11];
  string local_188 [68];
  int local_144;
  undefined1 local_124 [36];
  error_code local_100 [3];
  long local_d0;
  undefined4 local_c4;
  string *local_c0;
  char *local_b8;
  long local_98;
  undefined4 local_8c;
  string *local_88;
  char *local_80;
  long local_60;
  undefined4 local_54;
  string *local_50;
  char *local_48;
  long local_28;
  undefined4 local_1c;
  string *local_18;
  char *local_10;
  
  std::error_code::error_code
            ((error_code *)CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0));
  std::unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_>::operator*
            ((unique_ptr<asio::io_context,_std::default_delete<asio::io_context>_> *)
             CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0));
  MakeUniqueNoThrow<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,asio::io_context&>
            (in_stack_fffffffffffffcf8);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::operator=((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               *)CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0),
              (unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
               *)in_stack_fffffffffffffcc8);
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                 *)in_stack_fffffffffffffce0);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                      *)0x209de3);
  if (bVar1) {
    asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
              ((basic_endpoint<asio::ip::udp> *)0x209e06);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      asio::ip::make_address
                (in_stack_fffffffffffffcd8,
                 (error_code *)CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0));
      bVar1 = std::error_code::operator_cast_to_bool(local_100);
      if (bVar1) {
        std::error_code::message_abi_cxx11_(in_stack_fffffffffffffce8);
        EVar7 = (ErrorType)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        iVar2 = std::error_code::value(local_100);
        local_d0 = (long)iVar2;
        local_b8 = "Provided InterfaceAddress was invalid";
        local_c4 = 2;
        local_c0 = local_188;
        pcVar5 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   in_stack_fffffffffffffce0,EVar7,
                   CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0));
        in_RDI->Source = pcVar5;
        std::__cxx11::string::~string(local_188);
        return (Result)in_RDI;
      }
      asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                ((basic_endpoint<asio::ip::udp> *)
                 CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0),
                 in_stack_fffffffffffffcc8,0);
      asio::ip::basic_endpoint<asio::ip::udp>::operator=
                ((basic_endpoint<asio::ip::udp> *)
                 CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0),
                 (basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffcc8);
    }
    else {
      local_144 = (int)asio::ip::udp::v4();
      asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
                ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffce0,
                 (udp *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd6);
      asio::ip::basic_endpoint<asio::ip::udp>::operator=
                ((basic_endpoint<asio::ip::udp> *)
                 CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0),
                 (basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffcc8);
    }
    pbVar4 = &std::
              unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
              ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                            *)0x20a04e)->
              super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
    local_1b4[0] = (int)asio::ip::basic_endpoint<asio::ip::udp>::protocol
                                  ((basic_endpoint<asio::ip::udp> *)in_stack_fffffffffffffcc8);
    local_1c8 = asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>::
                open(pbVar4,(char *)local_1b4,(int)local_100);
    bVar1 = std::error_code::operator_cast_to_bool(local_100);
    if (bVar1) {
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffce8);
      EVar7 = (ErrorType)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      iVar2 = std::error_code::value(local_100);
      local_98 = (long)iVar2;
      local_80 = "UDP socket open failed";
      local_8c = 2;
      local_88 = local_1e8;
      pcVar5 = (char *)operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                 in_stack_fffffffffffffce0,EVar7,
                 CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0));
      in_RDI->Source = pcVar5;
      std::__cxx11::string::~string(local_1e8);
    }
    else {
      std::
      unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
      ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                    *)0x20a219);
      asio::detail::socket_option::boolean<1,_2>::boolean(&local_1ec,true);
      eVar6 = asio::basic_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>::
              set_option<asio::detail::socket_option::boolean<1,2>>
                        ((basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                          *)in_stack_fffffffffffffce0,(boolean<1,_2> *)in_stack_fffffffffffffcd8,
                         (error_code *)CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0)
                        );
      EVar7 = (ErrorType)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
      local_1f8 = eVar6._M_cat;
      local_200 = eVar6._M_value;
      bVar1 = std::error_code::operator_cast_to_bool(local_100);
      if (bVar1) {
        psVar8 = local_220;
        std::error_code::message_abi_cxx11_(in_stack_fffffffffffffce8);
        iVar2 = std::error_code::value(local_100);
        local_60 = (long)iVar2;
        local_48 = "UDP socket set_option reuse_address failed";
        local_54 = 2;
        local_50 = psVar8;
        pcVar5 = (char *)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffffcf0,(char *)in_stack_fffffffffffffce8,
                   in_stack_fffffffffffffce0,EVar7,
                   CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0));
        in_RDI->Source = pcVar5;
        std::__cxx11::string::~string(local_220);
      }
      else {
        pbVar4 = &std::
                  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                  ::operator->((unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
                                *)0x20a3c4)->
                  super_basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>;
        local_230 = asio::basic_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>
                    ::bind(pbVar4,(int)local_124,(sockaddr *)local_100,in_ECX);
        bVar1 = std::error_code::operator_cast_to_bool(local_100);
        if (bVar1) {
          desc = local_250;
          this_01 = local_100;
          std::error_code::message_abi_cxx11_(in_stack_fffffffffffffce8);
          iVar2 = std::error_code::value(this_01);
          EVar7 = (ErrorType)((ulong)this_01 >> 0x20);
          local_28 = (long)iVar2;
          local_10 = "UDP bind failed";
          local_1c = 2;
          source = in_RDI;
          local_18 = desc;
          this_00 = (ErrorResult *)operator_new(0x38);
          ErrorResult::ErrorResult
                    (this_00,(char *)source,desc,EVar7,
                     CONCAT26(in_stack_fffffffffffffcd6,in_stack_fffffffffffffcd0));
          source->Source = (char *)this_00;
          std::__cxx11::string::~string((string *)local_250);
        }
        else {
          PostNextRead_UDP(in_stack_fffffffffffffd10);
          Result::Success();
        }
      }
    }
  }
  else {
    Result::OutOfMemory();
  }
  return (Result)in_RDI;
}

Assistant:

Result SSDPRequester::InitializeSockets()
{
    asio::error_code ec;

    Socket_UDP = MakeUniqueNoThrow<asio::ip::udp::socket>(*Host->Context);
    if (!Socket_UDP) {
        return Result::OutOfMemory();
    }

    UDPAddress bindAddress;

    // If application specified an interface address:
    if (State->InterfaceAddress.empty()) {
        // Note: Asio default endpoint address is the any address e.g. INADDR_ANY
        bindAddress = UDPAddress(asio::ip::udp::v4(), 0);
    }
    else
    {
        // Convert provided interface address to Asio address
        const asio::ip::address bindAddr = asio::ip::make_address(State->InterfaceAddress, ec);
        if (ec) {
            return Result("Provided InterfaceAddress was invalid", ec.message(), ErrorType::Asio, ec.value());
        }

        // Bind to the provided interface address
        bindAddress = UDPAddress(bindAddr, 0);
    }

    Socket_UDP->open(bindAddress.protocol(), ec);
    if (ec) {
        return Result("UDP socket open failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->set_option(asio::socket_base::reuse_address(true), ec);
    if (ec) {
        return Result("UDP socket set_option reuse_address failed", ec.message(), ErrorType::Asio, ec.value());
    }
    Socket_UDP->bind(bindAddress, ec);
    if (ec) {
        return Result("UDP bind failed", ec.message(), ErrorType::Asio, ec.value());
    }

    // Start listening
    PostNextRead_UDP();

    return Result::Success();
}